

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ServiceGenerator::GenerateNewReflectiveServiceMethod
          (ServiceGenerator *this,Printer *printer)

{
  MethodDescriptor *method;
  MethodDescriptor *method_00;
  Printer *this_00;
  long lVar1;
  long lVar2;
  string local_50;
  
  io::Printer::Print(printer,
                     "public static com.google.protobuf.Service newReflectiveService(\n    final Interface impl) {\n  return new $classname$() {\n"
                     ,"classname",*(string **)this->descriptor_);
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(this->descriptor_ + 0x20); lVar2 = lVar2 + 1) {
    method_00 = (MethodDescriptor *)(*(long *)(this->descriptor_ + 0x28) + lVar1);
    this_00 = printer;
    io::Printer::Print(printer,"@java.lang.Override\n");
    GenerateMethodSignature((ServiceGenerator *)this_00,printer,method_00,IS_CONCRETE);
    UnderscoresToCamelCase_abi_cxx11_(&local_50,(java *)method_00,method);
    io::Printer::Print(printer," {\n  impl.$method$(controller, request, done);\n}\n\n","method",
                       &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar1 = lVar1 + 0x30;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"};\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void ServiceGenerator::GenerateNewReflectiveServiceMethod(
    io::Printer* printer) {
  printer->Print(
    "public static com.google.protobuf.Service newReflectiveService(\n"
    "    final Interface impl) {\n"
    "  return new $classname$() {\n",
    "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    printer->Print("@java.lang.Override\n");
    GenerateMethodSignature(printer, method, IS_CONCRETE);
    printer->Print(
      " {\n"
      "  impl.$method$(controller, request, done);\n"
      "}\n\n",
      "method", UnderscoresToCamelCase(method));
  }

  printer->Outdent();
  printer->Print("};\n");
  printer->Outdent();
  printer->Print("}\n\n");
}